

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

LY_ERR lys_parse_localfile(ly_ctx *ctx,char *name,char *revision,lysp_ctx *main_ctx,char *main_name,
                          ly_bool required,ly_set *new_mods,void **result)

{
  char **searchpaths;
  char *pcVar1;
  lysp_ctx *local_b0;
  char *pcStack_88;
  LY_ERR ret__;
  lysp_load_module_check_data check_data;
  lysp_submodule *plStack_60;
  LY_ERR ret;
  void *mod;
  char *pcStack_50;
  LYS_INFORMAT format;
  char *filepath;
  ly_in *in;
  char *pcStack_38;
  ly_bool required_local;
  char *main_name_local;
  lysp_ctx *main_ctx_local;
  char *revision_local;
  char *name_local;
  ly_ctx *ctx_local;
  
  pcStack_50 = (char *)0x0;
  mod._4_4_ = LYS_IN_UNKNOWN;
  plStack_60 = (lysp_submodule *)0x0;
  check_data.submoduleof._4_4_ = 0;
  in._7_1_ = required;
  pcStack_38 = main_name;
  main_name_local = (char *)main_ctx;
  main_ctx_local = (lysp_ctx *)revision;
  revision_local = name;
  name_local = (char *)ctx;
  memset(&stack0xffffffffffffff78,0,0x20);
  searchpaths = ly_ctx_get_searchdirs((ly_ctx *)name_local);
  ctx_local._4_4_ =
       lys_search_localfile
                 (searchpaths,((*(ushort *)(name_local + 0x102) & 0x10) != 0 ^ 0xffU) & 1,
                  revision_local,(char *)main_ctx_local,&stack0xffffffffffffffb0,
                  (LYS_INFORMAT *)((long)&mod + 4));
  if (ctx_local._4_4_ == LY_SUCCESS) {
    if (pcStack_50 == (char *)0x0) {
      if (in._7_1_ != '\0') {
        pcVar1 = "";
        if (main_ctx_local == (lysp_ctx *)0x0) {
          local_b0 = (lysp_ctx *)0x254298;
        }
        else {
          pcVar1 = "@";
          local_b0 = main_ctx_local;
        }
        ly_log((ly_ctx *)name_local,LY_LLERR,LY_ENOTFOUND,
               "Data model \"%s%s%s\" not found in local searchdirs.",revision_local,pcVar1,local_b0
              );
      }
      ctx_local._4_4_ = LY_ENOTFOUND;
    }
    else {
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Loading schema from \"%s\" file.",pcStack_50);
      check_data.submoduleof._4_4_ = ly_in_new_filepath(pcStack_50,0,(ly_in **)&filepath);
      if (check_data.submoduleof._4_4_ == LY_SUCCESS) {
        pcStack_88 = revision_local;
        check_data.name = (char *)main_ctx_local;
        check_data.revision = pcStack_50;
        check_data.path = pcStack_38;
        if (main_name_local == (char *)0x0) {
          check_data.submoduleof._4_4_ =
               lys_parse_in((ly_ctx *)name_local,(ly_in *)filepath,mod._4_4_,lysp_load_module_check,
                            &stack0xffffffffffffff78,new_mods,
                            (lys_module **)&stack0xffffffffffffffa0);
        }
        else {
          check_data.submoduleof._4_4_ =
               lys_parse_submodule((ly_ctx *)name_local,(ly_in *)filepath,mod._4_4_,
                                   (lysp_ctx *)main_name_local,lysp_load_module_check,
                                   &stack0xffffffffffffff78,new_mods,&stack0xffffffffffffffa0);
        }
        ly_in_free((ly_in *)filepath,'\x01');
        if (check_data.submoduleof._4_4_ == LY_SUCCESS) {
          *result = plStack_60;
        }
      }
      else {
        ly_log((ly_ctx *)name_local,LY_LLERR,check_data.submoduleof._4_4_,
               "Unable to create input handler for filepath %s.",pcStack_50);
      }
      free(pcStack_50);
      ctx_local._4_4_ = check_data.submoduleof._4_4_;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lys_parse_localfile(struct ly_ctx *ctx, const char *name, const char *revision, struct lysp_ctx *main_ctx,
        const char *main_name, ly_bool required, struct ly_set *new_mods, void **result)
{
    struct ly_in *in;
    char *filepath = NULL;
    LYS_INFORMAT format = 0;
    void *mod = NULL;
    LY_ERR ret = LY_SUCCESS;
    struct lysp_load_module_check_data check_data = {0};

    LY_CHECK_RET(lys_search_localfile(ly_ctx_get_searchdirs(ctx), !(ctx->flags & LY_CTX_DISABLE_SEARCHDIR_CWD), name,
            revision, &filepath, &format));
    if (!filepath) {
        if (required) {
            LOGERR(ctx, LY_ENOTFOUND, "Data model \"%s%s%s\" not found in local searchdirs.", name, revision ? "@" : "",
                    revision ? revision : "");
        }
        return LY_ENOTFOUND;
    }

    LOGVRB("Loading schema from \"%s\" file.", filepath);

    /* get the (sub)module */
    LY_CHECK_ERR_GOTO(ret = ly_in_new_filepath(filepath, 0, &in),
            LOGERR(ctx, ret, "Unable to create input handler for filepath %s.", filepath), cleanup);
    check_data.name = name;
    check_data.revision = revision;
    check_data.path = filepath;
    check_data.submoduleof = main_name;
    if (main_ctx) {
        ret = lys_parse_submodule(ctx, in, format, main_ctx, lysp_load_module_check, &check_data, new_mods,
                (struct lysp_submodule **)&mod);
    } else {
        ret = lys_parse_in(ctx, in, format, lysp_load_module_check, &check_data, new_mods, (struct lys_module **)&mod);

    }
    ly_in_free(in, 1);
    LY_CHECK_GOTO(ret, cleanup);

    *result = mod;

    /* success */

cleanup:
    free(filepath);
    return ret;
}